

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xss.cpp
# Opt level: O0

void __thiscall cppcms::xss::rules::html(rules *this,html_type t)

{
  data *pdVar1;
  int in_ESI;
  copy_ptr<cppcms::xss::rules::data> *in_RDI;
  
  if (in_ESI == 0) {
    pdVar1 = booster::copy_ptr<cppcms::xss::rules::data>::operator->(in_RDI);
    pdVar1->is_xhtml = true;
  }
  else if (in_ESI == 1) {
    pdVar1 = booster::copy_ptr<cppcms::xss::rules::data>::operator->(in_RDI);
    pdVar1->is_xhtml = false;
  }
  return;
}

Assistant:

void rules::html(rules::html_type t)
	{
		switch(t) {
		case html_input:
			d->is_xhtml=false;
			break;
		case xhtml_input:
			d->is_xhtml=true;
			break;
		}
	}